

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * QUtil::mac_roman_to_utf8(string *__return_storage_ptr__,string *val)

{
  undefined1 auVar1 [16];
  string local_60;
  ushort local_3e;
  unsigned_short ch_short;
  byte local_2d;
  uint local_2c;
  uchar ch;
  ulong uStack_28;
  uint i;
  size_t len;
  string *local_18;
  string *val_local;
  string *result;
  
  len._7_1_ = 0;
  local_18 = val;
  val_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uStack_28 = std::__cxx11::string::length();
  for (local_2c = 0; local_2c < uStack_28; local_2c = local_2c + 1) {
    auVar1 = std::__cxx11::string::at((ulong)local_18);
    local_2d = *auVar1._0_8_;
    local_3e = (ushort)local_2d;
    if (0x7f < local_2d) {
      local_3e = mac_roman_to_unicode[(int)(local_2d - 0x80)];
    }
    toUTF8_abi_cxx11_(&local_60,(QUtil *)(ulong)local_3e,auVar1._8_8_);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::mac_roman_to_utf8(std::string const& val)
{
    std::string result;
    size_t len = val.length();
    for (unsigned int i = 0; i < len; ++i) {
        unsigned char ch = static_cast<unsigned char>(val.at(i));
        unsigned short ch_short = ch;
        if (ch >= 128) {
            ch_short = mac_roman_to_unicode[ch - 128];
        }
        result += QUtil::toUTF8(ch_short);
    }
    return result;
}